

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O2

bool __thiscall
QDateTimeParser::fromString(QDateTimeParser *this,QString *t,QDate *date,QTime *time,int baseYear)

{
  bool bVar1;
  time_t tVar2;
  QDate QVar3;
  long in_FS_OFFSET;
  Data local_58;
  Data local_50;
  Data local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->defaultCenturyStart = baseYear;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (Data)0x2;
  baseDate((QDateTimeParser *)&local_50.data,(QTimeZone *)this);
  parse((StateNode *)&local_48.data,this,t,-1,(QDateTime *)&local_50.data,false);
  QDateTime::~QDateTime((QDateTime *)&local_50.data);
  QTimeZone::~QTimeZone((QTimeZone *)&local_58.s);
  if (((int)puStack_40 == 2) && ((char)local_38 == '\0')) {
    if (time != (QTime *)0x0) {
      tVar2 = QDateTime::time((QDateTime *)&local_48.data,(time_t *)this);
      local_50._0_4_ = (undefined4)tVar2;
      bVar1 = QTime::isValid((QTime *)&local_50.data);
      if (!bVar1) goto LAB_003c22be;
      time->mds = local_50._0_4_;
    }
    bVar1 = true;
    if (date == (QDate *)0x0) goto LAB_003c22c0;
    QVar3 = QDateTime::date((QDateTime *)&local_48.data);
    if (QVar3.jd + 0xb69eeff91fU < 0x16d3e147974) {
      date->jd = (qint64)QVar3;
      goto LAB_003c22c0;
    }
  }
LAB_003c22be:
  bVar1 = false;
LAB_003c22c0:
  QDateTime::~QDateTime((QDateTime *)&local_48.data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDateTimeParser::fromString(const QString &t, QDate *date, QTime *time, int baseYear) const
{
    defaultCenturyStart = baseYear;
    const StateNode tmp = parse(t, -1, baseDate(QTimeZone::UTC), false);
    if (tmp.state != Acceptable || tmp.conflicts)
        return false;

    if (time) {
        Q_ASSERT(!date);
        const QTime t = tmp.value.time();
        if (!t.isValid())
            return false;
        *time = t;
    }

    if (date) {
        Q_ASSERT(!time);
        const QDate d = tmp.value.date();
        if (!d.isValid())
            return false;
        *date = d;
    }
    return true;
}